

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

void __thiscall JSONNode::JSONNode(JSONNode *this,json_string *name_t,char *value_t)

{
  char *pcVar1;
  internalJSONNode *piVar2;
  size_t *psVar3;
  allocator local_51;
  json_string local_50;
  char *local_20;
  char *value_t_local;
  json_string *name_t_local;
  JSONNode *this_local;
  
  local_20 = value_t;
  value_t_local = (char *)name_t;
  name_t_local = (json_string *)this;
  piVar2 = internalJSONNode::newInternal('\0');
  pcVar1 = local_20;
  this->internal = piVar2;
  piVar2 = this->internal;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
  internalJSONNode::Set(piVar2,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  internalJSONNode::setname(this->internal,(json_string *)value_t_local);
  psVar3 = getCtorCounter();
  *psVar3 = *psVar3 + 1;
  return;
}

Assistant:

JSONNode::JSONNode(const json_string & name_t, const json_char * value_t) json_nothrow : internal(internalJSONNode::newInternal()){
	   internal -> Set(json_string(value_t));
	   internal -> setname(name_t);
	   LIBJSON_CTOR;
    }